

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t o_cmp_tval(void *a,void *b)

{
  int iVar1;
  object_kind *poVar2;
  object_kind *poVar3;
  wchar_t c;
  wchar_t tb;
  wchar_t ta;
  object_kind *k_b;
  object_kind *k_a;
  int b_val;
  int a_val;
  void *b_local;
  void *a_local;
  
  poVar2 = k_info + *a;
  poVar3 = k_info + *b;
  a_local._4_4_ = obj_group_order[poVar2->tval] - obj_group_order[poVar3->tval];
  if (a_local._4_4_ == L'\0') {
    iVar1 = (uint)(poVar2->aware & 1) - (uint)(poVar3->aware & 1);
    if (iVar1 == 0) {
      if ((poVar2->tval - 0x12U < 2) || (poVar2->tval - 0x1eU < 5)) {
        a_local._4_4_ = poVar2->sval - poVar3->sval;
      }
      else if ((poVar2->aware & 1U) == 0) {
        iVar1 = (uint)(poVar2->tried & 1) - (uint)(poVar3->tried & 1);
        if (iVar1 == 0) {
          a_local._4_4_ = strcmp(poVar2->flavor->text,poVar3->flavor->text);
        }
        else {
          a_local._4_4_ = -iVar1;
        }
      }
      else {
        a_local._4_4_ = strcmp(poVar2->name,poVar3->name);
      }
    }
    else {
      a_local._4_4_ = -iVar1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int o_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct object_kind *k_a = &k_info[a_val];
	const struct object_kind *k_b = &k_info[b_val];

	/* Group by */
	int ta = obj_group_order[k_a->tval];
	int tb = obj_group_order[k_b->tval];
	int c = ta - tb;
	if (c) return c;

	/* Order by */
	c = k_a->aware - k_b->aware;
	if (c) return -c; /* aware has low sort weight */

	switch (k_a->tval)
	{
		case TV_LIGHT:
		case TV_MAGIC_BOOK:
		case TV_PRAYER_BOOK:
		case TV_NATURE_BOOK:
		case TV_SHADOW_BOOK:
		case TV_OTHER_BOOK:
		case TV_DRAG_ARMOR:
			/* leave sorted by sval */
			break;

		default:
			if (k_a->aware)
				return strcmp(k_a->name, k_b->name);

			/* Then in tried order */
			c = k_a->tried - k_b->tried;
			if (c) return -c;

			return strcmp(k_a->flavor->text, k_b->flavor->text);
	}

	return k_a->sval - k_b->sval;
}